

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdqsort.h
# Opt level: O0

pair<__gnu_cxx::__normal_iterator<HighsDomainChange_*,_std::vector<HighsDomainChange,_std::allocator<HighsDomainChange>_>_>,_bool>
 pdqsort_detail::
 partition_right<__gnu_cxx::__normal_iterator<HighsDomainChange*,std::vector<HighsDomainChange,std::allocator<HighsDomainChange>>>,std::less<HighsDomainChange>>
           (HighsDomainChange *param_1,HighsDomainChange *param_2)

{
  HighsInt HVar1;
  HighsBoundType HVar2;
  bool bVar3;
  reference pHVar4;
  __normal_iterator<HighsDomainChange_*,_std::vector<HighsDomainChange,_std::allocator<HighsDomainChange>_>_>
  *p_Var5;
  reference pHVar6;
  pair<__gnu_cxx::__normal_iterator<HighsDomainChange_*,_std::vector<HighsDomainChange,_std::allocator<HighsDomainChange>_>_>,_bool>
  pVar7;
  __normal_iterator<HighsDomainChange_*,_std::vector<HighsDomainChange,_std::allocator<HighsDomainChange>_>_>
  pivot_pos;
  bool already_partitioned;
  __normal_iterator<HighsDomainChange_*,_std::vector<HighsDomainChange,_std::allocator<HighsDomainChange>_>_>
  last;
  __normal_iterator<HighsDomainChange_*,_std::vector<HighsDomainChange,_std::allocator<HighsDomainChange>_>_>
  first;
  T pivot;
  __normal_iterator<HighsDomainChange_*,_std::vector<HighsDomainChange,_std::allocator<HighsDomainChange>_>_>
  in_stack_ffffffffffffff68;
  __normal_iterator<HighsDomainChange_*,_std::vector<HighsDomainChange,_std::allocator<HighsDomainChange>_>_>
  in_stack_ffffffffffffff70;
  undefined7 in_stack_ffffffffffffff78;
  byte in_stack_ffffffffffffff7f;
  __normal_iterator<HighsDomainChange_*,_std::vector<HighsDomainChange,_std::allocator<HighsDomainChange>_>_>
  local_70;
  HighsDomainChange *local_68;
  HighsDomainChange *local_60;
  undefined1 local_51;
  HighsDomainChange *local_50;
  __normal_iterator<HighsDomainChange_*,_std::vector<HighsDomainChange,_std::allocator<HighsDomainChange>_>_>
  local_48;
  __normal_iterator<HighsDomainChange_*,_std::vector<HighsDomainChange,_std::allocator<HighsDomainChange>_>_>
  local_40;
  double local_38;
  undefined8 uStack_30;
  HighsDomainChange *local_20;
  __normal_iterator<HighsDomainChange_*,_std::vector<HighsDomainChange,_std::allocator<HighsDomainChange>_>_>
  local_18 [3];
  
  local_20 = param_2;
  local_18[0]._M_current = param_1;
  pHVar4 = __gnu_cxx::
           __normal_iterator<HighsDomainChange_*,_std::vector<HighsDomainChange,_std::allocator<HighsDomainChange>_>_>
           ::operator*(local_18);
  local_38 = pHVar4->boundval;
  uStack_30._0_4_ = pHVar4->column;
  uStack_30._4_4_ = pHVar4->boundtype;
  local_40._M_current = local_18[0]._M_current;
  local_48._M_current = local_20;
  do {
    p_Var5 = __gnu_cxx::
             __normal_iterator<HighsDomainChange_*,_std::vector<HighsDomainChange,_std::allocator<HighsDomainChange>_>_>
             ::operator++(&local_40);
    __gnu_cxx::
    __normal_iterator<HighsDomainChange_*,_std::vector<HighsDomainChange,_std::allocator<HighsDomainChange>_>_>
    ::operator*(p_Var5);
    bVar3 = std::less<HighsDomainChange>::operator()
                      ((less<HighsDomainChange> *)in_stack_ffffffffffffff70._M_current,
                       in_stack_ffffffffffffff68._M_current,(HighsDomainChange *)0x5f83fd);
  } while (bVar3);
  local_50 = (HighsDomainChange *)
             __gnu_cxx::
             __normal_iterator<HighsDomainChange_*,_std::vector<HighsDomainChange,_std::allocator<HighsDomainChange>_>_>
             ::operator-((__normal_iterator<HighsDomainChange_*,_std::vector<HighsDomainChange,_std::allocator<HighsDomainChange>_>_>
                          *)CONCAT17(in_stack_ffffffffffffff7f,in_stack_ffffffffffffff78),
                         in_stack_ffffffffffffff70._M_current);
  bVar3 = __gnu_cxx::operator==
                    ((__normal_iterator<HighsDomainChange_*,_std::vector<HighsDomainChange,_std::allocator<HighsDomainChange>_>_>
                      *)in_stack_ffffffffffffff70._M_current,
                     (__normal_iterator<HighsDomainChange_*,_std::vector<HighsDomainChange,_std::allocator<HighsDomainChange>_>_>
                      *)in_stack_ffffffffffffff68._M_current);
  if (bVar3) {
    do {
      bVar3 = __gnu_cxx::operator<
                        ((__normal_iterator<HighsDomainChange_*,_std::vector<HighsDomainChange,_std::allocator<HighsDomainChange>_>_>
                          *)in_stack_ffffffffffffff70._M_current,
                         (__normal_iterator<HighsDomainChange_*,_std::vector<HighsDomainChange,_std::allocator<HighsDomainChange>_>_>
                          *)in_stack_ffffffffffffff68._M_current);
      in_stack_ffffffffffffff7f = 0;
      if (bVar3) {
        p_Var5 = __gnu_cxx::
                 __normal_iterator<HighsDomainChange_*,_std::vector<HighsDomainChange,_std::allocator<HighsDomainChange>_>_>
                 ::operator--(&local_48);
        __gnu_cxx::
        __normal_iterator<HighsDomainChange_*,_std::vector<HighsDomainChange,_std::allocator<HighsDomainChange>_>_>
        ::operator*(p_Var5);
        bVar3 = std::less<HighsDomainChange>::operator()
                          ((less<HighsDomainChange> *)in_stack_ffffffffffffff70._M_current,
                           in_stack_ffffffffffffff68._M_current,(HighsDomainChange *)0x5f8475);
        in_stack_ffffffffffffff7f = bVar3 ^ 0xff;
      }
    } while ((in_stack_ffffffffffffff7f & 1) != 0);
  }
  else {
    do {
      p_Var5 = __gnu_cxx::
               __normal_iterator<HighsDomainChange_*,_std::vector<HighsDomainChange,_std::allocator<HighsDomainChange>_>_>
               ::operator--(&local_48);
      __gnu_cxx::
      __normal_iterator<HighsDomainChange_*,_std::vector<HighsDomainChange,_std::allocator<HighsDomainChange>_>_>
      ::operator*(p_Var5);
      bVar3 = std::less<HighsDomainChange>::operator()
                        ((less<HighsDomainChange> *)in_stack_ffffffffffffff70._M_current,
                         in_stack_ffffffffffffff68._M_current,(HighsDomainChange *)0x5f84af);
    } while (((bVar3 ^ 0xffU) & 1) != 0);
  }
  local_51 = __gnu_cxx::operator>=
                       ((__normal_iterator<HighsDomainChange_*,_std::vector<HighsDomainChange,_std::allocator<HighsDomainChange>_>_>
                         *)in_stack_ffffffffffffff70._M_current,
                        (__normal_iterator<HighsDomainChange_*,_std::vector<HighsDomainChange,_std::allocator<HighsDomainChange>_>_>
                         *)in_stack_ffffffffffffff68._M_current);
  while (bVar3 = __gnu_cxx::operator<
                           ((__normal_iterator<HighsDomainChange_*,_std::vector<HighsDomainChange,_std::allocator<HighsDomainChange>_>_>
                             *)in_stack_ffffffffffffff70._M_current,
                            (__normal_iterator<HighsDomainChange_*,_std::vector<HighsDomainChange,_std::allocator<HighsDomainChange>_>_>
                             *)in_stack_ffffffffffffff68._M_current), bVar3) {
    local_60 = local_40._M_current;
    local_68 = local_48._M_current;
    std::
    iter_swap<__gnu_cxx::__normal_iterator<HighsDomainChange*,std::vector<HighsDomainChange,std::allocator<HighsDomainChange>>>,__gnu_cxx::__normal_iterator<HighsDomainChange*,std::vector<HighsDomainChange,std::allocator<HighsDomainChange>>>>
              (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
    do {
      p_Var5 = __gnu_cxx::
               __normal_iterator<HighsDomainChange_*,_std::vector<HighsDomainChange,_std::allocator<HighsDomainChange>_>_>
               ::operator++(&local_40);
      __gnu_cxx::
      __normal_iterator<HighsDomainChange_*,_std::vector<HighsDomainChange,_std::allocator<HighsDomainChange>_>_>
      ::operator*(p_Var5);
      bVar3 = std::less<HighsDomainChange>::operator()
                        ((less<HighsDomainChange> *)in_stack_ffffffffffffff70._M_current,
                         in_stack_ffffffffffffff68._M_current,(HighsDomainChange *)0x5f852f);
    } while (bVar3);
    do {
      p_Var5 = __gnu_cxx::
               __normal_iterator<HighsDomainChange_*,_std::vector<HighsDomainChange,_std::allocator<HighsDomainChange>_>_>
               ::operator--(&local_48);
      __gnu_cxx::
      __normal_iterator<HighsDomainChange_*,_std::vector<HighsDomainChange,_std::allocator<HighsDomainChange>_>_>
      ::operator*(p_Var5);
      bVar3 = std::less<HighsDomainChange>::operator()
                        ((less<HighsDomainChange> *)in_stack_ffffffffffffff70._M_current,
                         in_stack_ffffffffffffff68._M_current,(HighsDomainChange *)0x5f855d);
    } while (((bVar3 ^ 0xffU) & 1) != 0);
  }
  local_70 = __gnu_cxx::
             __normal_iterator<HighsDomainChange_*,_std::vector<HighsDomainChange,_std::allocator<HighsDomainChange>_>_>
             ::operator-((__normal_iterator<HighsDomainChange_*,_std::vector<HighsDomainChange,_std::allocator<HighsDomainChange>_>_>
                          *)CONCAT17(in_stack_ffffffffffffff7f,in_stack_ffffffffffffff78),
                         in_stack_ffffffffffffff70._M_current);
  p_Var5 = &local_70;
  pHVar4 = __gnu_cxx::
           __normal_iterator<HighsDomainChange_*,_std::vector<HighsDomainChange,_std::allocator<HighsDomainChange>_>_>
           ::operator*(p_Var5);
  pHVar6 = __gnu_cxx::
           __normal_iterator<HighsDomainChange_*,_std::vector<HighsDomainChange,_std::allocator<HighsDomainChange>_>_>
           ::operator*(local_18);
  HVar1 = pHVar4->column;
  HVar2 = pHVar4->boundtype;
  pHVar6->boundval = pHVar4->boundval;
  pHVar6->column = HVar1;
  pHVar6->boundtype = HVar2;
  pHVar6 = __gnu_cxx::
           __normal_iterator<HighsDomainChange_*,_std::vector<HighsDomainChange,_std::allocator<HighsDomainChange>_>_>
           ::operator*(p_Var5);
  pHVar6->boundval = local_38;
  pHVar6->column = (undefined4)uStack_30;
  pHVar6->boundtype = uStack_30._4_4_;
  pVar7 = std::
          make_pair<__gnu_cxx::__normal_iterator<HighsDomainChange*,std::vector<HighsDomainChange,std::allocator<HighsDomainChange>>>&,bool&>
                    (p_Var5,(bool *)pHVar4);
  return pVar7;
}

Assistant:

inline std::pair<Iter, bool> partition_right(Iter begin, Iter end, Compare comp) {
        typedef typename std::iterator_traits<Iter>::value_type T;
        
        // Move pivot into local for speed.
        T pivot(PDQSORT_PREFER_MOVE(*begin));

        Iter first = begin;
        Iter last = end;

        // Find the first element greater than or equal than the pivot (the median of 3 guarantees
        // this exists).
        while (comp(*++first, pivot));

        // Find the first element strictly smaller than the pivot. We have to guard this search if
        // there was no element before *first.
        if (first - 1 == begin) while (first < last && !comp(*--last, pivot));
        else                    while (                !comp(*--last, pivot));

        // If the first pair of elements that should be swapped to partition are the same element,
        // the passed in sequence already was correctly partitioned.
        bool already_partitioned = first >= last;
        
        // Keep swapping pairs of elements that are on the wrong side of the pivot. Previously
        // swapped pairs guard the searches, which is why the first iteration is special-cased
        // above.
        while (first < last) {
            std::iter_swap(first, last);
            while (comp(*++first, pivot));
            while (!comp(*--last, pivot));
        }

        // Put the pivot in the right place.
        Iter pivot_pos = first - 1;
        *begin = PDQSORT_PREFER_MOVE(*pivot_pos);
        *pivot_pos = PDQSORT_PREFER_MOVE(pivot);

        return std::make_pair(pivot_pos, already_partitioned);
    }